

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O2

bool crnlib::utils::write_obj<unsigned_short>
               (unsigned_short *obj,void **pBuf,uint *buf_size,bool buffer_is_little_endian)

{
  uint uVar1;
  unsigned_short *puVar2;
  uint8 *pDst;
  
  uVar1 = *buf_size;
  if (1 < uVar1) {
    puVar2 = (unsigned_short *)*pBuf;
    if (buffer_is_little_endian) {
      *puVar2 = *obj;
    }
    else {
      *(undefined1 *)puVar2 = *(undefined1 *)((long)obj + 1);
      *(char *)((long)puVar2 + 1) = (char)*obj;
    }
    *pBuf = (void *)((long)*pBuf + 2);
    *buf_size = *buf_size - 2;
  }
  return 1 < uVar1;
}

Assistant:

inline bool write_obj(const T& obj, void*& pBuf, uint& buf_size, bool buffer_is_little_endian)
        {
            if (buf_size < sizeof(T))
            {
                return false;
            }

            utils::write_obj(obj, pBuf, buffer_is_little_endian);

            pBuf = static_cast<uint8*>(pBuf) + sizeof(T);
            buf_size -= sizeof(T);

            return true;
        }